

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_panel_bmod.h
# Opt level: O1

void __thiscall
Eigen::internal::SparseLUImpl<double,_int>::panel_bmod
          (SparseLUImpl<double,_int> *this,int m,int w,int jcol,int nseg,ScalarVector *dense,
          ScalarVector *tempv,IndexVector *segrep,IndexVector *repfnz,GlobalLU_t *glu)

{
  Matrix<double,__1,_1,_0,__1,_1> *lusup;
  Matrix<int,__1,_1,_0,__1,_1> *lsub;
  double *pdVar1;
  int iVar2;
  int lptr;
  int iVar3;
  int *piVar4;
  double *pdVar5;
  int *piVar6;
  double *pdVar7;
  Nested pMVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  int *piVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  char *pcVar17;
  int iVar18;
  uint uVar19;
  double *__s;
  long lVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  PointerType pdVar32;
  long lVar33;
  int iVar34;
  double *pdVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  double *local_1b8;
  PointerType local_1b0;
  PointerType local_1a8;
  long local_1a0;
  long local_190;
  long local_188;
  long local_180;
  ulong local_178;
  ulong local_170;
  undefined1 local_168 [8];
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> dense_col;
  double *pdStack_138;
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_> U;
  Index outerSize;
  PointerType local_70;
  Index innerSize;
  int local_38;
  int local_34;
  int luptr;
  
  iVar18 = w + jcol;
  iVar9 = iVar18;
  if (iVar18 < jcol) {
    iVar9 = jcol;
  }
  uVar14 = 0;
  if (0 < nseg) {
    pdVar32 = (PointerType)(long)m;
    lusup = &glu->lusup;
    lsub = &glu->lsub;
    lVar20 = (long)jcol;
    lVar36 = (long)iVar18;
    local_190 = (long)iVar9;
    local_188 = -(long)pdVar32;
    U.m_stride.super_Stride<_1,_0>._8_8_ = (long)pdVar32 * 4;
    local_180 = (long)pdVar32 * 8;
    uVar38 = (ulong)(uint)nseg;
    local_34 = m;
    do {
      if (((long)uVar38 < 1) ||
         ((segrep->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
          (long)uVar38)) {
LAB_0014f6bb:
        pcVar17 = 
        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
        ;
        goto LAB_0014f6e7;
      }
      uVar38 = uVar38 - 1;
      iVar9 = (segrep->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_data
              [uVar38];
      lVar21 = (long)iVar9;
      if ((lVar21 < 0) ||
         ((((glu->supno).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows <= lVar21 ||
           (lVar12 = (long)(glu->supno).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data[lVar21], lVar12 < 0)) ||
          ((glu->xsup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
           <= lVar12)))) goto LAB_0014f6bb;
      iVar2 = (glu->xsup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
              m_data[lVar12];
      lVar12 = (long)iVar2;
      if (lVar12 < -1) goto LAB_0014f6bb;
      lVar16 = lVar12 + 1;
      lVar27 = (glu->xlsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      if (((lVar27 <= lVar16) || (iVar2 == -1)) || (lVar27 <= lVar12)) goto LAB_0014f6bb;
      piVar4 = (glu->xlsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      lptr = piVar4[lVar12];
      if (w < 1) {
        local_70 = (PointerType)0x0;
        uVar19 = 0;
      }
      else {
        piVar13 = (repfnz->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data;
        uVar24 = 0;
        uVar19 = 0;
        local_70 = (PointerType)0x0;
        lVar27 = lVar20;
        do {
          if (piVar13 != (int *)0x0 && local_34 < 0) goto LAB_0014f73e;
          if (((long)(uVar24 | (ulong)pdVar32) < 0) ||
             ((repfnz->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              - (long)pdVar32 < (long)uVar24)) goto LAB_0014f727;
          if (local_34 <= iVar9) goto LAB_0014f710;
          if (piVar13[lVar21] != -1) {
            uVar30 = (iVar9 + 1) - piVar13[lVar21];
            uVar19 = uVar19 + 1;
            if ((int)local_70 < (int)uVar30) {
              local_70 = (PointerType)(ulong)uVar30;
            }
          }
          lVar27 = lVar27 + 1;
          piVar13 = (int *)((long)piVar13 + U.m_stride.super_Stride<_1,_0>._8_8_);
          uVar24 = uVar24 + (long)pdVar32;
        } while (lVar27 < lVar36);
      }
      uVar30 = (~(iVar9 - iVar2) + piVar4[lVar12 + 1]) - lptr;
      local_178 = uVar14;
      local_170 = uVar38;
      if (0 < iVar9 - iVar2) {
        pdStack_138 = (tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
        lVar27 = (long)(int)uVar19;
        U.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
        .m_data = local_70;
        U.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
        .m_rows.m_value = lVar27;
        if ((int)uVar19 < 0 && pdStack_138 != (double *)0x0) {
          pcVar17 = 
          "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, -1>, 1, Eigen::OuterStride<>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, -1>, 1, Eigen::OuterStride<>>, Level = 0]"
          ;
          goto LAB_0014f76a;
        }
        if (((ulong)pdStack_138 & 0xf) != 0) {
          __assert_fail("(!(internal::traits<Derived>::Flags&AlignedBit) || ((size_t(m_data) % 16) == 0)) && \"data is not aligned\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/MapBase.h"
                        ,0xa0,
                        "void Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, -1>, 1, Eigen::OuterStride<>>, 0>::checkSanity() const [Derived = Eigen::Map<Eigen::Matrix<double, -1, -1>, 1, Eigen::OuterStride<>>, Level = 0]"
                       );
        }
        uVar10 = (uint)local_70 + 1 & 0xfffffffe;
        U.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value = (long)uVar10;
        uVar11 = 0;
        if (0 < (int)(uint)local_70) {
          uVar11 = (uint)local_70;
        }
        if (jcol < iVar18) {
          piVar4 = (repfnz->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          lVar25 = (repfnz->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                   m_rows;
          pdVar5 = (dense->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                   .m_data;
          lVar33 = (dense->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                   .m_rows;
          piVar13 = (glu->xlusup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data;
          lVar26 = (glu->xlusup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          iVar29 = 0;
          lVar28 = lVar20;
          do {
            uVar14 = (lVar28 - lVar20) * (long)pdVar32;
            piVar6 = piVar4 + uVar14;
            if ((local_34 < 0) && (piVar6 != (int *)0x0)) goto LAB_0014f73e;
            if (((long)(uVar14 | (ulong)pdVar32) < 0) || (lVar25 - (long)pdVar32 < (long)uVar14))
            goto LAB_0014f727;
            pdVar7 = pdVar5 + uVar14;
            if ((local_34 < 0) && (pdVar7 != (double *)0x0)) goto LAB_0014f755;
            if (lVar33 - (long)pdVar32 < (long)uVar14) goto LAB_0014f774;
            if (local_34 <= iVar9) goto LAB_0014f710;
            iVar23 = piVar6[lVar21];
            if (iVar23 != -1) {
              if (lVar26 <= lVar12) goto LAB_0014f6bb;
              local_38 = piVar13[lVar12];
              uVar31 = ~(iVar9 - iVar23) + (uint)local_70;
              if (0 < (int)uVar31) {
                if (((int)uVar19 <= iVar29) || (iVar29 < 0)) {
LAB_0014f6f1:
                  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                                ,0x151,
                                "Scalar &Eigen::DenseCoeffsBase<Eigen::Map<Eigen::Matrix<double, -1, -1>, 1, Eigen::OuterStride<>>, 1>::operator()(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, -1>, 1, Eigen::OuterStride<>>, Level = 1]"
                               );
                }
                uVar14 = 0;
                do {
                  if (uVar11 == uVar14) goto LAB_0014f6f1;
                  pdStack_138
                  [iVar29 * U.
                            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
                            .
                            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
                            .m_cols.m_value + uVar14] = 0.0;
                  uVar14 = uVar14 + 1;
                } while (uVar31 != uVar14);
              }
              if (-1 < iVar9 - iVar23) {
                iVar34 = (lptr - iVar2) + iVar23;
                piVar6 = (glu->lsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data;
                lVar15 = (long)(int)uVar31;
                lVar22 = (long)iVar34;
                uVar14 = (ulong)(uint)((iVar9 + 1) - iVar23);
                do {
                  if ((iVar34 < 0) ||
                     ((glu->lsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows <= lVar22)) goto LAB_0014f6bb;
                  iVar23 = piVar6[lVar22];
                  if (((long)iVar23 < 0) || (local_34 <= iVar23)) goto LAB_0014f6d2;
                  if (((((int)uVar31 < 0) || (iVar29 < 0)) || ((long)local_70 <= lVar15)) ||
                     ((int)uVar19 <= iVar29)) goto LAB_0014f6f1;
                  pdStack_138
                  [iVar29 * U.
                            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
                            .
                            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
                            .m_cols.m_value + lVar15] = pdVar7[iVar23];
                  lVar22 = lVar22 + 1;
                  lVar15 = lVar15 + 1;
                  uVar14 = uVar14 - 1;
                } while (uVar14 != 0);
              }
              iVar29 = iVar29 + 1;
            }
            lVar28 = lVar28 + 1;
          } while (lVar28 != local_190);
        }
        lVar25 = (glu->xlusup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage
                 .m_rows;
        if (lVar12 < lVar25) {
          piVar4 = (glu->xlusup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
          local_38 = piVar4[lVar12];
          if (lVar16 < lVar25) {
            lVar12 = (long)piVar4[lVar12 + 1] - (long)piVar4[lVar12];
            local_38 = ((int)lVar12 + 1) * ((iVar9 - ((uint)local_70 + iVar2)) + 1) + local_38;
            if ((int)lVar12 < 0) {
LAB_0014f793:
              __assert_fail("innerStride>=0 && outerStride>=0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Stride.h"
                            ,0x40,
                            "Eigen::Stride<-1, 0>::Stride(Index, Index) [_OuterStrideAtCompileTime = -1, _InnerStrideAtCompileTime = 0]"
                           );
            }
            local_1b8 = (glu->lusup).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data + local_38;
            local_168 = (undefined1  [8])&local_1b8;
            dense_col.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
            super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
            m_rows.m_value = (long)local_70;
            local_1a8 = local_70;
            local_1b0 = local_70;
            local_1a0 = lVar12;
            dense_col.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
            super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
            m_data = pdStack_138;
            dense_col.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
            super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
            _16_8_ = lVar27;
            dense_col.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
            super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_xpr
                 = (Nested)U.
                           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
                           .
                           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
                           .m_cols.m_value;
            TriangularView<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>,5u>
            ::
            solveInPlace<1,Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,Eigen::OuterStride<_1>>>
                      ((TriangularView<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,5u>
                        *)local_168,
                       (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>_>
                        *)&pdStack_138);
            lVar16 = (long)local_38;
            local_38 = (int)((int)(uint)local_70 + lVar16);
            pdVar5 = (glu->lusup).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data;
            if (-1 < (int)uVar30 || pdVar5 == (double *)0x0) {
              if ((tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows <= (long)(int)((uVar10 + uVar30) * w + 1)) {
                __assert_fail("tempv.size()>w*ldu + nrow*w + 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseLU/SparseLU_panel_bmod.h"
                              ,0x91,
                              "void Eigen::internal::SparseLUImpl<double, int>::panel_bmod(const Index, const Index, const Index, const Index, ScalarVector &, ScalarVector &, IndexVector &, IndexVector &, GlobalLU_t &) [Scalar = double, Index = int]"
                             );
              }
              pdVar5 = pdVar5 + (int)(uint)local_70 + lVar16;
              if ((int)uVar30 < -2) goto LAB_0014f793;
              uVar14 = (ulong)(int)uVar30;
              pdVar7 = (tempv->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data;
              if (-1 < (int)(uVar19 | uVar30) || pdVar7 == (double *)0x0) {
                if ((int)(uVar19 | uVar30) < 0) {
                  __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/CwiseNullaryOp.h"
                                ,0x3f,
                                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Map<Eigen::Matrix<double, -1, -1>, 0, Eigen::OuterStride<>>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Map<Eigen::Matrix<double, -1, -1>, 0, Eigen::OuterStride<>>]"
                               );
                }
                lVar25 = (long)(int)(uVar10 * w);
                uVar38 = (ulong)((uint)(((ulong)pdVar5 & 7) == 0) &
                                (uint)((ulong)pdVar5 >> 3) & 0x1fffffff);
                pdVar1 = pdVar7 + lVar25 + uVar38;
                lVar16 = (long)(int)((uVar30 - ((int)(uVar30 + 1) >> 0x1f)) + 1 & 0xfffffffe);
                if (0 < (int)uVar19) {
                  uVar24 = (ulong)((uint)((ulong)pdVar1 >> 3) & 1);
                  if ((long)uVar14 <= (long)uVar24) {
                    uVar24 = uVar14;
                  }
                  if (((ulong)pdVar1 & 7) != 0) {
                    uVar24 = uVar14;
                  }
                  pdVar35 = pdVar7 + uVar38 + lVar25;
                  __s = pdVar1;
                  lVar33 = lVar27;
                  do {
                    if (0 < (long)uVar24) {
                      memset(__s,0,uVar24 * 8);
                    }
                    uVar37 = uVar14 - uVar24 & 0xfffffffffffffffe;
                    lVar26 = uVar37 + uVar24;
                    if (0 < (long)uVar37) {
                      lVar28 = uVar24 + 2;
                      if ((long)(uVar24 + 2) < lVar26) {
                        lVar28 = lVar26;
                      }
                      memset(pdVar35 + uVar24,0,(~uVar24 + lVar28 & 0xfffffffffffffffe) * 8 + 0x10);
                    }
                    if (uVar14 - lVar26 != 0 && lVar26 <= (long)uVar14) {
                      memset(__s + uVar37 + uVar24,0,(uVar14 - lVar26) * 8);
                    }
                    uVar24 = (long)uVar24 % 2;
                    if ((long)uVar14 < (long)uVar24) {
                      uVar24 = uVar14;
                    }
                    pdVar35 = pdVar35 + lVar16;
                    __s = __s + lVar16;
                    lVar33 = lVar33 + -1;
                  } while (lVar33 != 0);
                }
                sparselu_gemm<double,long>
                          (uVar14,lVar27,(long)local_70,pdVar5,lVar12,pdStack_138,
                           U.
                           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
                           .
                           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
                           .m_cols.m_value,pdVar1,lVar16);
                if (0 < w) {
                  piVar4 = (repfnz->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                           m_storage.m_data;
                  lVar12 = (repfnz->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                           m_storage.m_rows;
                  pdVar5 = (dense->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_data;
                  lVar27 = (dense->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_rows;
                  iVar29 = 0;
                  lVar33 = lVar20;
                  do {
                    uVar24 = (lVar33 - lVar20) * (long)pdVar32;
                    piVar13 = piVar4 + uVar24;
                    if ((local_34 < 0) && (piVar13 != (int *)0x0)) goto LAB_0014f73e;
                    if (((long)(uVar24 | (ulong)pdVar32) < 0) ||
                       (lVar12 - (long)pdVar32 < (long)uVar24)) goto LAB_0014f727;
                    pdVar1 = pdVar5 + uVar24;
                    if ((local_34 < 0) && (pdVar1 != (double *)0x0)) goto LAB_0014f755;
                    if (lVar27 - (long)pdVar32 < (long)uVar24) goto LAB_0014f774;
                    if (local_34 <= iVar9) goto LAB_0014f710;
                    iVar23 = piVar13[lVar21];
                    if (iVar23 != -1) {
                      iVar34 = (lptr - iVar2) + iVar23;
                      if (-1 < iVar9 - iVar23) {
                        lVar28 = U.
                                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_1>
                                 .
                                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_Eigen::OuterStride<_1>_>,_0>
                                 .m_cols.m_value * iVar29;
                        lVar26 = (long)(int)(~(iVar9 - iVar23) + (uint)local_70);
                        piVar13 = (glu->lsub).
                                  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data;
                        uVar24 = 0;
                        do {
                          if ((iVar34 < 0) ||
                             ((glu->lsub).
                              super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                              m_rows <= (long)((long)iVar34 + uVar24))) goto LAB_0014f6bb;
                          iVar3 = piVar13[(long)iVar34 + uVar24];
                          if (((long)iVar3 < 0) || (local_34 <= iVar3)) goto LAB_0014f6d2;
                          pdVar1[iVar3] = pdStack_138[lVar28 + lVar26 + uVar24];
                          pdStack_138[lVar28 + lVar26 + uVar24] = 0.0;
                          uVar24 = uVar24 + 1;
                        } while ((uint)((iVar9 + 1) - iVar23) != uVar24);
                        iVar34 = iVar34 + (int)uVar24;
                      }
                      if (0 < (int)uVar30) {
                        piVar13 = (glu->lsub).
                                  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data;
                        lVar26 = (long)iVar29 * lVar16 * 8 + lVar25 * 8 + uVar38 * 8;
                        lVar28 = 0;
                        do {
                          if ((iVar34 < 0) ||
                             ((glu->lsub).
                              super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                              m_rows <= iVar34 + lVar28)) goto LAB_0014f6bb;
                          iVar23 = piVar13[iVar34 + lVar28];
                          lVar15 = (long)iVar23;
                          if ((lVar15 < 0) || (local_34 <= iVar23)) goto LAB_0014f6d2;
                          pdVar1[lVar15] =
                               pdVar1[lVar15] - *(double *)((long)pdVar7 + lVar28 * 8 + lVar26);
                          *(undefined8 *)((long)pdVar7 + lVar28 * 8 + lVar26) = 0;
                          lVar28 = lVar28 + 1;
                        } while (lVar28 < (long)uVar14);
                      }
                      iVar29 = iVar29 + 1;
                    }
                    lVar33 = lVar33 + 1;
                  } while (lVar33 < lVar36);
                }
                goto LAB_0014f67c;
              }
            }
            pcVar17 = 
            "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, -1>, 0, Eigen::OuterStride<>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, -1>, 0, Eigen::OuterStride<>>, Level = 0]"
            ;
            goto LAB_0014f76a;
          }
        }
        goto LAB_0014f6bb;
      }
      if (0 < w) {
        lVar33 = 0;
        uVar14 = 0;
        lVar25 = 0;
        lVar27 = lVar20;
        do {
          piVar4 = (repfnz->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          if ((local_34 < 0) && ((long)piVar4 + lVar25 != 0)) goto LAB_0014f73e;
          if (((long)(uVar14 | (ulong)pdVar32) < 0) ||
             ((repfnz->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              - (long)pdVar32 < (long)uVar14)) goto LAB_0014f727;
          local_168 = (undefined1  [8])
                      ((long)(dense->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                             .m_storage.m_data + lVar33);
          pMVar8 = (Nested)(dense->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_rows;
          dense_col.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
          super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
          m_data = pdVar32;
          if ((local_34 < 0) && (local_168 != (undefined1  [8])0x0)) goto LAB_0014f755;
          uVar14 = uVar14 + (long)pdVar32;
          dense_col.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
          super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
          _16_8_ = dense;
          dense_col.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
          super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_xpr =
               pMVar8;
          if ((long)pMVar8 - (long)pdVar32 < (long)(local_188 + uVar14)) goto LAB_0014f774;
          if (local_34 <= iVar9) goto LAB_0014f710;
          iVar29 = *(int *)((long)piVar4 + lVar25 + lVar21 * 4);
          if (iVar29 != -1) {
            lVar26 = (glu->xlusup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows;
            if (lVar26 <= lVar12) goto LAB_0014f6bb;
            piVar4 = (glu->xlusup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data;
            local_38 = piVar4[lVar12];
            if (lVar26 <= lVar16) goto LAB_0014f6bb;
            iVar23 = iVar9 - iVar29;
            iVar34 = piVar4[lVar12 + 1] - piVar4[lVar12];
            iVar29 = iVar29 - iVar2;
            if (iVar23 == 2) {
              LU_kernel_bmod<3>::
              run<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<int,_1,1,0,_1,1>,int>
                        (3,(VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_168,
                         tempv,lusup,&local_38,iVar34,uVar30,lsub,lptr,iVar29);
            }
            else if (iVar23 == 1) {
              LU_kernel_bmod<2>::
              run<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<int,_1,1,0,_1,1>,int>
                        (2,(VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_168,
                         tempv,lusup,&local_38,iVar34,uVar30,lsub,lptr,iVar29);
            }
            else if (iVar23 == 0) {
              LU_kernel_bmod<1>::
              run<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<int,_1,1,0,_1,1>,int>
                        (1,(VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_168,
                         tempv,lusup,&local_38,iVar34,uVar30,lsub,lptr,iVar29);
            }
            else {
              LU_kernel_bmod<-1>::
              run<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<int,_1,1,0,_1,1>,int>
                        (iVar23 + 1,
                         (VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_168,tempv,
                         lusup,&local_38,iVar34,uVar30,lsub,lptr,iVar29);
            }
          }
          lVar25 = lVar25 + U.m_stride.super_Stride<_1,_0>._8_8_;
          lVar33 = lVar33 + local_180;
          lVar27 = lVar27 + 1;
        } while (lVar27 < lVar36);
      }
LAB_0014f67c:
      uVar19 = (int)local_178 + 1;
      uVar14 = (ulong)uVar19;
      uVar38 = local_170;
    } while (uVar19 != nseg);
  }
  return;
LAB_0014f6d2:
  pcVar17 = 
  "Scalar &Eigen::DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 1]"
  ;
  goto LAB_0014f6e7;
LAB_0014f73e:
  pcVar17 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>, Level = 0]"
  ;
  goto LAB_0014f76a;
LAB_0014f727:
  pcVar17 = 
  "Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<int, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
  goto LAB_0014f789;
LAB_0014f755:
  pcVar17 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
  ;
LAB_0014f76a:
  __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/MapBase.h"
                ,0x94,pcVar17);
LAB_0014f774:
  pcVar17 = 
  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_0014f789:
  __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Block.h"
                ,0x8d,pcVar17);
LAB_0014f710:
  pcVar17 = 
  "Scalar &Eigen::DenseCoeffsBase<Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>, Level = 1]"
  ;
LAB_0014f6e7:
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                ,0x18a,pcVar17);
}

Assistant:

void SparseLUImpl<Scalar,Index>::panel_bmod(const Index m, const Index w, const Index jcol, 
                                            const Index nseg, ScalarVector& dense, ScalarVector& tempv,
                                            IndexVector& segrep, IndexVector& repfnz, GlobalLU_t& glu)
{
  
  Index ksub,jj,nextl_col; 
  Index fsupc, nsupc, nsupr, nrow; 
  Index krep, kfnz; 
  Index lptr; // points to the row subscripts of a supernode 
  Index luptr; // ...
  Index segsize,no_zeros ; 
  // For each nonz supernode segment of U[*,j] in topological order
  Index k = nseg - 1; 
  const Index PacketSize = internal::packet_traits<Scalar>::size;
  
  for (ksub = 0; ksub < nseg; ksub++)
  { // For each updating supernode
    /* krep = representative of current k-th supernode
     * fsupc =  first supernodal column
     * nsupc = number of columns in a supernode
     * nsupr = number of rows in a supernode
     */
    krep = segrep(k); k--; 
    fsupc = glu.xsup(glu.supno(krep)); 
    nsupc = krep - fsupc + 1; 
    nsupr = glu.xlsub(fsupc+1) - glu.xlsub(fsupc); 
    nrow = nsupr - nsupc; 
    lptr = glu.xlsub(fsupc); 
    
    // loop over the panel columns to detect the actual number of columns and rows
    Index u_rows = 0;
    Index u_cols = 0;
    for (jj = jcol; jj < jcol + w; jj++)
    {
      nextl_col = (jj-jcol) * m; 
      VectorBlock<IndexVector> repfnz_col(repfnz, nextl_col, m); // First nonzero column index for each row
      
      kfnz = repfnz_col(krep); 
      if ( kfnz == emptyIdxLU ) 
        continue; // skip any zero segment
      
      segsize = krep - kfnz + 1;
      u_cols++;
      u_rows = (std::max)(segsize,u_rows);
    }
    
    if(nsupc >= 2)
    { 
      Index ldu = internal::first_multiple<Index>(u_rows, PacketSize);
      Map<Matrix<Scalar,Dynamic,Dynamic>, Aligned,  OuterStride<> > U(tempv.data(), u_rows, u_cols, OuterStride<>(ldu));
      
      // gather U
      Index u_col = 0;
      for (jj = jcol; jj < jcol + w; jj++)
      {
        nextl_col = (jj-jcol) * m; 
        VectorBlock<IndexVector> repfnz_col(repfnz, nextl_col, m); // First nonzero column index for each row
        VectorBlock<ScalarVector> dense_col(dense, nextl_col, m); // Scatter/gather entire matrix column from/to here
        
        kfnz = repfnz_col(krep); 
        if ( kfnz == emptyIdxLU ) 
          continue; // skip any zero segment
        
        segsize = krep - kfnz + 1;
        luptr = glu.xlusup(fsupc);    
        no_zeros = kfnz - fsupc; 
        
        Index isub = lptr + no_zeros;
        Index off = u_rows-segsize;
        for (Index i = 0; i < off; i++) U(i,u_col) = 0;
        for (Index i = 0; i < segsize; i++)
        {
          Index irow = glu.lsub(isub); 
          U(i+off,u_col) = dense_col(irow); 
          ++isub; 
        }
        u_col++;
      }
      // solve U = A^-1 U
      luptr = glu.xlusup(fsupc);
      Index lda = glu.xlusup(fsupc+1) - glu.xlusup(fsupc);
      no_zeros = (krep - u_rows + 1) - fsupc;
      luptr += lda * no_zeros + no_zeros;
      Map<Matrix<Scalar,Dynamic,Dynamic>, 0, OuterStride<> > A(glu.lusup.data()+luptr, u_rows, u_rows, OuterStride<>(lda) );
      U = A.template triangularView<UnitLower>().solve(U);
      
      // update
      luptr += u_rows;
      Map<Matrix<Scalar,Dynamic,Dynamic>, 0, OuterStride<> > B(glu.lusup.data()+luptr, nrow, u_rows, OuterStride<>(lda) );
      eigen_assert(tempv.size()>w*ldu + nrow*w + 1);
      
      Index ldl = internal::first_multiple<Index>(nrow, PacketSize);
      Index offset = (PacketSize-internal::first_aligned(B.data(), PacketSize)) % PacketSize;
      Map<Matrix<Scalar,Dynamic,Dynamic>, 0, OuterStride<> > L(tempv.data()+w*ldu+offset, nrow, u_cols, OuterStride<>(ldl));
      
      L.setZero();
      internal::sparselu_gemm<Scalar>(L.rows(), L.cols(), B.cols(), B.data(), B.outerStride(), U.data(), U.outerStride(), L.data(), L.outerStride());
      
      // scatter U and L
      u_col = 0;
      for (jj = jcol; jj < jcol + w; jj++)
      {
        nextl_col = (jj-jcol) * m; 
        VectorBlock<IndexVector> repfnz_col(repfnz, nextl_col, m); // First nonzero column index for each row
        VectorBlock<ScalarVector> dense_col(dense, nextl_col, m); // Scatter/gather entire matrix column from/to here
        
        kfnz = repfnz_col(krep); 
        if ( kfnz == emptyIdxLU ) 
          continue; // skip any zero segment
        
        segsize = krep - kfnz + 1;
        no_zeros = kfnz - fsupc; 
        Index isub = lptr + no_zeros;
        
        Index off = u_rows-segsize;
        for (Index i = 0; i < segsize; i++)
        {
          Index irow = glu.lsub(isub++); 
          dense_col(irow) = U.coeff(i+off,u_col);
          U.coeffRef(i+off,u_col) = 0;
        }
        
        // Scatter l into SPA dense[]
        for (Index i = 0; i < nrow; i++)
        {
          Index irow = glu.lsub(isub++); 
          dense_col(irow) -= L.coeff(i,u_col);
          L.coeffRef(i,u_col) = 0;
        }
        u_col++;
      }
    }
    else // level 2 only
    {
      // Sequence through each column in the panel
      for (jj = jcol; jj < jcol + w; jj++)
      {
        nextl_col = (jj-jcol) * m; 
        VectorBlock<IndexVector> repfnz_col(repfnz, nextl_col, m); // First nonzero column index for each row
        VectorBlock<ScalarVector> dense_col(dense, nextl_col, m); // Scatter/gather entire matrix column from/to here
        
        kfnz = repfnz_col(krep); 
        if ( kfnz == emptyIdxLU ) 
          continue; // skip any zero segment
        
        segsize = krep - kfnz + 1;
        luptr = glu.xlusup(fsupc);
        
        Index lda = glu.xlusup(fsupc+1)-glu.xlusup(fsupc);// nsupr
        
        // Perform a trianglar solve and block update, 
        // then scatter the result of sup-col update to dense[]
        no_zeros = kfnz - fsupc; 
              if(segsize==1)  LU_kernel_bmod<1>::run(segsize, dense_col, tempv, glu.lusup, luptr, lda, nrow, glu.lsub, lptr, no_zeros);
        else  if(segsize==2)  LU_kernel_bmod<2>::run(segsize, dense_col, tempv, glu.lusup, luptr, lda, nrow, glu.lsub, lptr, no_zeros);
        else  if(segsize==3)  LU_kernel_bmod<3>::run(segsize, dense_col, tempv, glu.lusup, luptr, lda, nrow, glu.lsub, lptr, no_zeros);
        else                  LU_kernel_bmod<Dynamic>::run(segsize, dense_col, tempv, glu.lusup, luptr, lda, nrow, glu.lsub, lptr, no_zeros); 
      } // End for each column in the panel 
    }
    
  } // End for each updating supernode
}